

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

int UnityCheckArraysForNull(void *expected,void *actual,_U_UINT lineNumber,char *msg)

{
  char *msg_local;
  _U_UINT lineNumber_local;
  void *actual_local;
  void *expected_local;
  
  if ((expected == (void *)0x0) && (actual == (void *)0x0)) {
    expected_local._4_4_ = 1;
  }
  else {
    if (expected == (void *)0x0) {
      UnityTestResultsFailBegin(lineNumber);
      UnityPrint(" Expected pointer to be NULL");
      UnityAddMsgIfSpecified(msg);
      Unity.CurrentTestFailed = 1;
      longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
    }
    if (actual == (void *)0x0) {
      UnityTestResultsFailBegin(lineNumber);
      UnityPrint(" Actual pointer was NULL");
      UnityAddMsgIfSpecified(msg);
      Unity.CurrentTestFailed = 1;
      longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
    }
    expected_local._4_4_ = 0;
  }
  return expected_local._4_4_;
}

Assistant:

static int UnityCheckArraysForNull(UNITY_INTERNAL_PTR expected, UNITY_INTERNAL_PTR actual, const UNITY_LINE_TYPE lineNumber, const char* msg)
{
    /* return true if they are both NULL */
    if ((expected == NULL) && (actual == NULL))
        return 1;

    /* throw error if just expected is NULL */
    if (expected == NULL)
    {
        UnityTestResultsFailBegin(lineNumber);
        UnityPrint(UnityStrNullPointerForExpected);
        UnityAddMsgIfSpecified(msg);
        UNITY_FAIL_AND_BAIL;
    }

    /* throw error if just actual is NULL */
    if (actual == NULL)
    {
        UnityTestResultsFailBegin(lineNumber);
        UnityPrint(UnityStrNullPointerForActual);
        UnityAddMsgIfSpecified(msg);
        UNITY_FAIL_AND_BAIL;
    }

    /* return false if neither is NULL */
    return 0;
}